

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

void predict_or_learn<true,false>(cbify *data,single_learner *base,example *ec)

{
  size_t sVar1;
  int iVar2;
  learner<char,_example> *this;
  undefined8 uVar3;
  action_score *paVar4;
  long in_RDX;
  cbify *in_RDI;
  stringstream __msg_1;
  cb_class cl;
  stringstream __msg;
  uint32_t chosen_action;
  label csl;
  label_t ld;
  cb_class *in_stack_fffffffffffffbf8;
  v_array<CB::cb_class> *in_stack_fffffffffffffc00;
  example *in_stack_fffffffffffffc08;
  learner<char,_example> *in_stack_fffffffffffffc10;
  undefined7 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  undefined1 uVar5;
  int in_stack_fffffffffffffc24;
  uint32_t *in_stack_fffffffffffffc28;
  vw_exception *in_stack_fffffffffffffc30;
  score_iterator *in_stack_fffffffffffffc38;
  uint64_t in_stack_fffffffffffffc40;
  ostream local_3b0;
  float local_234;
  uint32_t local_230;
  float local_22c;
  undefined1 local_221;
  stringstream local_1f0 [16];
  ostream local_1e0;
  uint local_44;
  undefined8 local_20;
  long local_18;
  cbify *local_8;
  
  local_20 = *(undefined8 *)(in_RDX + 0x6828);
  local_18 = in_RDX;
  local_8 = in_RDI;
  v_array<CB::cb_class>::clear(in_stack_fffffffffffffc00);
  *(cb_class **)(local_18 + 0x6828) = (local_8->cb_label).costs._begin;
  *(cb_class **)(local_18 + 0x6830) = (local_8->cb_label).costs._end;
  *(cb_class **)(local_18 + 0x6838) = (local_8->cb_label).costs.end_array;
  *(size_t *)(local_18 + 0x6840) = (local_8->cb_label).costs.erase_count;
  *(action_score **)(local_18 + 0x6850) = (local_8->a_s)._begin;
  *(action_score **)(local_18 + 0x6858) = (local_8->a_s)._end;
  *(action_score **)(local_18 + 0x6860) = (local_8->a_s).end_array;
  *(size_t *)(local_18 + 0x6868) = (local_8->a_s).erase_count;
  LEARNER::learner<char,_example>::predict
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(size_t)in_stack_fffffffffffffc00);
  sVar1 = local_8->example_counter;
  local_8->example_counter = sVar1 + 1;
  this = (learner<char,_example> *)(local_8->app_seed + sVar1);
  ACTION_SCORE::begin_scores((action_scores *)in_stack_fffffffffffffc08);
  ACTION_SCORE::end_scores((action_scores *)in_stack_fffffffffffffc08);
  iVar2 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                    (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                     (score_iterator *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  if (iVar2 != 0) {
    std::__cxx11::stringstream::stringstream(local_1f0);
    std::operator<<(&local_1e0,"Failed to sample from pdf");
    local_221 = 1;
    uVar3 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc24
               ,(string *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
    local_221 = 0;
    __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_230 = local_44 + 1;
  paVar4 = v_array<ACTION_SCORE::action_score>::operator[]
                     ((v_array<ACTION_SCORE::action_score> *)(local_18 + 0x6850),(ulong)local_44);
  local_22c = paVar4->score;
  if (local_230 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffc40);
    std::operator<<(&local_3b0,"No action with non-zero probability found!");
    uVar5 = 1;
    uVar3 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc24
               ,(string *)CONCAT17(uVar5,in_stack_fffffffffffffc18));
    __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_234 = loss(local_8,(uint32_t)local_20,local_230);
  v_array<CB::cb_class>::push_back(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  *(cb_class **)(local_18 + 0x6828) = (local_8->cb_label).costs._begin;
  *(cb_class **)(local_18 + 0x6830) = (local_8->cb_label).costs._end;
  *(cb_class **)(local_18 + 0x6838) = (local_8->cb_label).costs.end_array;
  *(size_t *)(local_18 + 0x6840) = (local_8->cb_label).costs.erase_count;
  LEARNER::learner<char,_example>::learn
            (this,in_stack_fffffffffffffc08,(size_t)in_stack_fffffffffffffc00);
  v_array<ACTION_SCORE::action_score>::clear
            ((v_array<ACTION_SCORE::action_score> *)in_stack_fffffffffffffc00);
  (local_8->a_s)._begin = *(action_score **)(local_18 + 0x6850);
  (local_8->a_s)._end = *(action_score **)(local_18 + 0x6858);
  (local_8->a_s).end_array = *(action_score **)(local_18 + 0x6860);
  (local_8->a_s).erase_count = *(size_t *)(local_18 + 0x6868);
  *(undefined8 *)(local_18 + 0x6828) = local_20;
  *(uint32_t *)(local_18 + 0x6850) = local_230;
  return;
}

Assistant:

void predict_or_learn(cbify& data, single_learner& base, example& ec)
{
  // Store the multiclass or cost-sensitive input label
  MULTICLASS::label_t ld;
  COST_SENSITIVE::label csl;
  if (use_cs)
    csl = ec.l.cs;
  else
    ld = ec.l.multi;

  data.cb_label.costs.clear();
  ec.l.cb = data.cb_label;
  ec.pred.a_s = data.a_s;

  // Call the cb_explore algorithm. It returns a vector of probabilities for each action
  base.predict(ec);
  // data.probs = ec.pred.scalars;

  uint32_t chosen_action;
  if (sample_after_normalizing(
          data.app_seed + data.example_counter++, begin_scores(ec.pred.a_s), end_scores(ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

  CB::cb_class cl;
  cl.action = chosen_action + 1;
  cl.probability = ec.pred.a_s[chosen_action].score;

  if (!cl.action)
    THROW("No action with non-zero probability found!");
  if (use_cs)
    cl.cost = loss_cs(data, csl.costs, cl.action);
  else
    cl.cost = loss(data, ld.label, cl.action);

  // Create a new cb label
  data.cb_label.costs.push_back(cl);
  ec.l.cb = data.cb_label;

  if (is_learn)
    base.learn(ec);

  data.a_s.clear();
  data.a_s = ec.pred.a_s;

  if (use_cs)
    ec.l.cs = csl;
  else
    ec.l.multi = ld;

  ec.pred.multiclass = cl.action;
}